

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_rc.cpp
# Opt level: O2

RK_S32 mpp_pid_calc(MppPIDCtx *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = p->div;
  iVar3 = p->coef_d * p->d + p->coef_i * p->i + p->coef_p * p->p;
  iVar2 = -iVar1;
  if (-1 < iVar3) {
    iVar2 = iVar1;
  }
  return (iVar2 / 2 + iVar3) / iVar1;
}

Assistant:

RK_S32 mpp_pid_calc(MppPIDCtx *p)
{
    RK_S32 a = p->p * p->coef_p + p->i * p->coef_i + p->d * p->coef_d;
    RK_S32 b = p->div;

    mpp_rc_dbg_rc("RC: pid ctx %p p %10d coef %d\n", p, p->p, p->coef_p);
    mpp_rc_dbg_rc("RC: pid ctx %p i %10d coef %d\n", p, p->i, p->coef_i);
    mpp_rc_dbg_rc("RC: pid ctx %p d %10d coef %d\n", p, p->d, p->coef_d);
    mpp_rc_dbg_rc("RC: pid ctx %p a %10d b %d\n", p, a, b);

    return DIV(a, b);
}